

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetworkLayerValidator.cpp
# Opt level: O2

Result * __thiscall
CoreML::NeuralNetworkSpecValidator::validateBatchnormLayer
          (Result *__return_storage_ptr__,NeuralNetworkSpecValidator *this,NeuralNetworkLayer *layer
          )

{
  string *this_00;
  uint64_t expectedUnits;
  void *pvVar1;
  bool bVar2;
  WeightParamType WVar3;
  Result *_result;
  undefined1 *puVar4;
  undefined1 *weight;
  bool bVar5;
  allocator<char> local_9a;
  allocator<char> local_99;
  string err;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  validateInputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  this_00 = &__return_storage_ptr__->m_message;
  std::__cxx11::string::~string((string *)this_00);
  validateOutputCount(__return_storage_ptr__,layer,1,1);
  bVar2 = Result::good(__return_storage_ptr__);
  if (!bVar2) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::~string((string *)this_00);
  if (this->ndArrayInterpretation == true) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_50,"Batchnorm",(allocator<char> *)&err);
    validateInputOutputRankEquality(__return_storage_ptr__,layer,&local_50,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&local_50);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&err,"Batchnorm",(allocator<char> *)&local_70);
    validateRankCount(__return_storage_ptr__,layer,&err,3,-1,&this->blobNameToRank);
    std::__cxx11::string::~string((string *)&err);
    bVar2 = Result::good(__return_storage_ptr__);
    if (!bVar2) {
      return __return_storage_ptr__;
    }
    std::__cxx11::string::~string((string *)this_00);
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    puVar4 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar4 = Specification::_BatchnormLayerParams_default_instance_;
  }
  puVar4 = (undefined1 *)(((ActivationParams *)puVar4)->NonlinearityType_).linear_;
  if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
    puVar4 = Specification::_WeightParams_default_instance_;
  }
  WVar3 = valueType((WeightParams *)puVar4);
  if (WVar3 == FLOAT32) {
LAB_002a2628:
    bVar2 = false;
  }
  else {
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar4 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar4 = Specification::_BatchnormLayerParams_default_instance_;
    }
    puVar4 = (undefined1 *)((InnerProductLayerParams *)puVar4)->bias_;
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType((WeightParams *)puVar4);
    if (WVar3 == FLOAT32) goto LAB_002a2628;
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar4 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar4 = Specification::_BatchnormLayerParams_default_instance_;
    }
    puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->mean_;
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType((WeightParams *)puVar4);
    if (WVar3 == FLOAT32) goto LAB_002a2628;
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar4 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar4 = Specification::_BatchnormLayerParams_default_instance_;
    }
    puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->variance_;
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType((WeightParams *)puVar4);
    bVar2 = WVar3 != FLOAT32;
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    puVar4 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar4 = Specification::_BatchnormLayerParams_default_instance_;
  }
  puVar4 = (undefined1 *)(((ActivationParams *)puVar4)->NonlinearityType_).linear_;
  if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
    puVar4 = Specification::_WeightParams_default_instance_;
  }
  WVar3 = valueType((WeightParams *)puVar4);
  if (WVar3 == FLOAT16) {
LAB_002a26f7:
    bVar5 = false;
  }
  else {
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar4 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar4 = Specification::_BatchnormLayerParams_default_instance_;
    }
    puVar4 = (undefined1 *)((InnerProductLayerParams *)puVar4)->bias_;
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType((WeightParams *)puVar4);
    if (WVar3 == FLOAT16) goto LAB_002a26f7;
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar4 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar4 = Specification::_BatchnormLayerParams_default_instance_;
    }
    puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->mean_;
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType((WeightParams *)puVar4);
    if (WVar3 == FLOAT16) goto LAB_002a26f7;
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar4 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar4 = Specification::_BatchnormLayerParams_default_instance_;
    }
    puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->variance_;
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType((WeightParams *)puVar4);
    bVar5 = WVar3 != FLOAT16;
  }
  if (layer->_oneof_case_[0] == 0xa0) {
    puVar4 = *(undefined1 **)&layer->layer_;
  }
  else {
    puVar4 = Specification::_BatchnormLayerParams_default_instance_;
  }
  puVar4 = (undefined1 *)(((ActivationParams *)puVar4)->NonlinearityType_).linear_;
  if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
    puVar4 = Specification::_WeightParams_default_instance_;
  }
  WVar3 = valueType((WeightParams *)puVar4);
  if (WVar3 != UNSPECIFIED) {
    if (layer->_oneof_case_[0] == 0xa0) {
      puVar4 = *(undefined1 **)&layer->layer_;
    }
    else {
      puVar4 = Specification::_BatchnormLayerParams_default_instance_;
    }
    puVar4 = (undefined1 *)((InnerProductLayerParams *)puVar4)->bias_;
    if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
      puVar4 = Specification::_WeightParams_default_instance_;
    }
    WVar3 = valueType((WeightParams *)puVar4);
    if (WVar3 != UNSPECIFIED) {
      if (layer->_oneof_case_[0] == 0xa0) {
        puVar4 = *(undefined1 **)&layer->layer_;
      }
      else {
        puVar4 = Specification::_BatchnormLayerParams_default_instance_;
      }
      puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->mean_;
      if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
        puVar4 = Specification::_WeightParams_default_instance_;
      }
      WVar3 = valueType((WeightParams *)puVar4);
      if (WVar3 != UNSPECIFIED) {
        if (layer->_oneof_case_[0] == 0xa0) {
          puVar4 = *(undefined1 **)&layer->layer_;
        }
        else {
          puVar4 = Specification::_BatchnormLayerParams_default_instance_;
        }
        puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->variance_;
        if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
          puVar4 = Specification::_WeightParams_default_instance_;
        }
        WVar3 = valueType((WeightParams *)puVar4);
        if ((WVar3 != UNSPECIFIED) && (bVar2 || bVar5)) {
          if (layer->_oneof_case_[0] == 0xa0) {
            puVar4 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar4 = Specification::_BatchnormLayerParams_default_instance_;
          }
          weight = (undefined1 *)(((ActivationParams *)puVar4)->NonlinearityType_).linear_;
          if ((WeightParams *)weight == (WeightParams *)0x0) {
            weight = Specification::_WeightParams_default_instance_;
          }
          expectedUnits = ((BatchnormLayerParams *)puVar4)->channels_;
          std::__cxx11::string::string<std::allocator<char>>((string *)&err,"BatchNorm",&local_99);
          pvVar1 = (layer->name_).tagged_ptr_.ptr_;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"gamma",&local_9a);
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)weight,expectedUnits,1,&err,
                     (string *)((ulong)pvVar1 & 0xfffffffffffffffe),&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&err);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)this_00);
          if (layer->_oneof_case_[0] == 0xa0) {
            puVar4 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar4 = Specification::_BatchnormLayerParams_default_instance_;
          }
          puVar4 = (undefined1 *)((InnerProductLayerParams *)puVar4)->bias_;
          if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
            puVar4 = Specification::_WeightParams_default_instance_;
          }
          std::__cxx11::string::string<std::allocator<char>>((string *)&err,"BatchNorm",&local_99);
          pvVar1 = (layer->name_).tagged_ptr_.ptr_;
          std::__cxx11::string::string<std::allocator<char>>((string *)&local_70,"beta",&local_9a);
          validateGeneralWeightParams
                    (__return_storage_ptr__,(WeightParams *)puVar4,expectedUnits,1,&err,
                     (string *)((ulong)pvVar1 & 0xfffffffffffffffe),&local_70);
          std::__cxx11::string::~string((string *)&local_70);
          std::__cxx11::string::~string((string *)&err);
          bVar2 = Result::good(__return_storage_ptr__);
          if (!bVar2) {
            return __return_storage_ptr__;
          }
          std::__cxx11::string::~string((string *)this_00);
          if (layer->_oneof_case_[0] == 0xa0) {
            puVar4 = *(undefined1 **)&layer->layer_;
          }
          else {
            puVar4 = Specification::_BatchnormLayerParams_default_instance_;
          }
          if (((BatchnormLayerParams *)puVar4)->computemeanvar_ != false) {
LAB_002a2a1c:
            Result::Result(__return_storage_ptr__);
            return __return_storage_ptr__;
          }
          puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->mean_;
          if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
            puVar4 = Specification::_WeightParams_default_instance_;
          }
          WVar3 = valueType((WeightParams *)puVar4);
          if (WVar3 != EMPTY) {
            if (layer->_oneof_case_[0] == 0xa0) {
              puVar4 = *(undefined1 **)&layer->layer_;
            }
            else {
              puVar4 = Specification::_BatchnormLayerParams_default_instance_;
            }
            puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->mean_;
            if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
              puVar4 = Specification::_WeightParams_default_instance_;
            }
            WVar3 = valueType((WeightParams *)puVar4);
            if (WVar3 != EMPTY) {
              if (layer->_oneof_case_[0] == 0xa0) {
                puVar4 = *(undefined1 **)&layer->layer_;
              }
              else {
                puVar4 = Specification::_BatchnormLayerParams_default_instance_;
              }
              puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->mean_;
              if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
                puVar4 = Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"BatchNorm",&local_99);
              pvVar1 = (layer->name_).tagged_ptr_.ptr_;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"mean",&local_9a);
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar4,expectedUnits,1,&err,
                         (string *)((ulong)pvVar1 & 0xfffffffffffffffe),&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&err);
              bVar2 = Result::good(__return_storage_ptr__);
              if (!bVar2) {
                return __return_storage_ptr__;
              }
              std::__cxx11::string::~string((string *)this_00);
              if (layer->_oneof_case_[0] == 0xa0) {
                puVar4 = *(undefined1 **)&layer->layer_;
              }
              else {
                puVar4 = Specification::_BatchnormLayerParams_default_instance_;
              }
              puVar4 = (undefined1 *)((BatchnormLayerParams *)puVar4)->variance_;
              if ((WeightParams *)puVar4 == (WeightParams *)0x0) {
                puVar4 = Specification::_WeightParams_default_instance_;
              }
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&err,"BatchNorm",&local_99);
              pvVar1 = (layer->name_).tagged_ptr_.ptr_;
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_70,"variance",&local_9a);
              validateGeneralWeightParams
                        (__return_storage_ptr__,(WeightParams *)puVar4,expectedUnits,1,&err,
                         (string *)((ulong)pvVar1 & 0xfffffffffffffffe),&local_70);
              std::__cxx11::string::~string((string *)&local_70);
              std::__cxx11::string::~string((string *)&err);
              bVar2 = Result::good(__return_storage_ptr__);
              if (!bVar2) {
                return __return_storage_ptr__;
              }
              std::__cxx11::string::~string((string *)this_00);
              goto LAB_002a2a1c;
            }
          }
          std::operator+(&local_70,"Batchnorm layer \'",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
          std::operator+(&err,&local_70,"\' is missing mean and variance.");
          std::__cxx11::string::~string((string *)&local_70);
          Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
          goto LAB_002a280a;
        }
      }
    }
  }
  std::operator+(&local_70,"Batchnorm layer \'",
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((ulong)(layer->name_).tagged_ptr_.ptr_ & 0xfffffffffffffffe));
  std::operator+(&err,&local_70,
                 "\' parameters have values for both full and half precision. Parameters should either be specified in half or full precision, mixed parameters are not supported."
                );
  std::__cxx11::string::~string((string *)&local_70);
  Result::Result(__return_storage_ptr__,INVALID_MODEL_PARAMETERS,&err);
LAB_002a280a:
  std::__cxx11::string::~string((string *)&err);
  return __return_storage_ptr__;
}

Assistant:

Result NeuralNetworkSpecValidator::validateBatchnormLayer(const Specification::NeuralNetworkLayer& layer) {
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputCount(layer, 1, 1));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateOutputCount(layer, 1, 1));

    if (ndArrayInterpretation) {
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateInputOutputRankEquality(layer, "Batchnorm", blobNameToRank));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateRankCount(layer, "Batchnorm", 3, -1, blobNameToRank));
    }

    // Check parameters types
    bool has_f32_params = ((valueType(layer.batchnorm().gamma()) == FLOAT32) || (valueType(layer.batchnorm().beta()) == FLOAT32) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT32)  || (valueType(layer.batchnorm().variance()) == FLOAT32));
    bool has_f16_params = ((valueType(layer.batchnorm().gamma()) == FLOAT16) || (valueType(layer.batchnorm().beta()) == FLOAT16) ||
                           (valueType(layer.batchnorm().mean()) == FLOAT16)  || (valueType(layer.batchnorm().variance()) == FLOAT16));
    bool invalid_params = ((valueType(layer.batchnorm().gamma()) == UNSPECIFIED) || (valueType(layer.batchnorm().beta()) == UNSPECIFIED) ||
                           (valueType(layer.batchnorm().mean()) == UNSPECIFIED)  || (valueType(layer.batchnorm().variance()) == UNSPECIFIED));
    if ((has_f32_params && has_f16_params) || invalid_params) {
        std::string err = "Batchnorm layer '" + layer.name() + "' parameters have values for both full and half precision. Parameters "
        "should either be specified in half or full precision, mixed parameters are not supported.";
        return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
    }

    // Check parameters length
    uint64_t num_channels = static_cast<uint64_t>(layer.batchnorm().channels());
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().gamma(), num_channels, 1, "BatchNorm", layer.name(), "gamma"));
    HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().beta(), num_channels, 1, "BatchNorm", layer.name(), "beta"));

    // Check existence of mean / variance
    if (!layer.batchnorm().computemeanvar()) {
        if (valueType(layer.batchnorm().mean()) == EMPTY || valueType(layer.batchnorm().mean()) == EMPTY){
            const std::string err = "Batchnorm layer '" + layer.name() + "' is missing mean and variance.";
            return Result(ResultType::INVALID_MODEL_PARAMETERS, err);
        }
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().mean(), num_channels, 1, "BatchNorm", layer.name(), "mean"));
        HANDLE_RESULT_AND_RETURN_ON_ERROR(validateGeneralWeightParams(layer.batchnorm().variance(), num_channels, 1, "BatchNorm", layer.name(), "variance"));
    }
    return Result();
}